

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O0

void __thiscall OpenMD::PairList::removePair(PairList *this,int i,int j)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  key_type *in_RDI;
  iterator iter;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc8;
  _Self local_28;
  pair<int,_int> local_20;
  _Self local_18;
  int local_10;
  int local_c [3];
  
  if (in_ESI != in_EDX) {
    if (in_EDX < in_ESI) {
      std::swap<int>(local_c,&local_10);
    }
    local_20 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffffb8,(int *)0x1fd6a4);
    local_18._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::find(in_stack_ffffffffffffffc8._M_node,in_RDI);
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (bVar1) {
      std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::erase_abi_cxx11_((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                          *)in_RDI,in_stack_ffffffffffffffc8);
      *(undefined1 *)&in_RDI[9].first = 1;
    }
  }
  return;
}

Assistant:

void PairList::removePair(int i, int j) {
    if (i == j) {
      return;
    } else if (i > j) {
      std::swap(i, j);
    }

    std::set<std::pair<int, int>>::iterator iter =
        pairSet_.find(std::make_pair(i, j));

    if (iter != pairSet_.end()) {
      pairSet_.erase(iter);
      modified_ = true;
    }
  }